

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuthorFileParser.hpp
# Opt level: O2

void __thiscall AuthorFileParser::writeAuthorList(AuthorFileParser *this,string *authorListFilename)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)authorListFilename);
  BOWFileParser::writeWordList(&this->super_BOWFileParser,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void writeAuthorList(std::string authorListFilename)const{
        writeWordList(authorListFilename);
    }